

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2Dgridsearch.cpp
# Opt level: O2

bool __thiscall
SBPL2DGridSearch::search
          (SBPL2DGridSearch *this,uchar **Grid2D,uchar obsthresh,int startx_c,int starty_c,
          int goalx_c,int goaly_c,SBPL_2DGRIDSEARCH_TERM_CONDITION termination_condition)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  SBPL_Exception *this_00;
  allocator<char> local_1c1;
  string local_1c0;
  stringstream ss;
  ostream local_190 [376];
  
  iVar1 = this->downsample_;
  if (this->OPENtype_ == SBPL_2DGRIDSEARCH_OPENTYPE_SLIDINGBUCKETS) {
    bVar2 = search_withslidingbuckets
                      (this,Grid2D,obsthresh,startx_c / iVar1,starty_c / iVar1,goalx_c / iVar1,
                       goaly_c / iVar1,termination_condition);
  }
  else {
    if (this->OPENtype_ != SBPL_2DGRIDSEARCH_OPENTYPE_HEAP) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,"ERROR: unknown data structure type = ",&local_1c1);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&ss,(string *)&local_1c0,_S_out|_S_in);
      std::__cxx11::string::~string((string *)&local_1c0);
      poVar3 = (ostream *)std::ostream::operator<<(local_190,this->OPENtype_);
      std::operator<<(poVar3," for OPEN2D");
      this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      SBPL_Exception::SBPL_Exception(this_00,&local_1c0);
      __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar2 = search_withheap(this,Grid2D,obsthresh,startx_c / iVar1,starty_c / iVar1,goalx_c / iVar1,
                            goaly_c / iVar1,termination_condition);
  }
  return bVar2;
}

Assistant:

bool SBPL2DGridSearch::search(unsigned char** Grid2D, unsigned char obsthresh, int startx_c, int starty_c, int goalx_c,
                              int goaly_c, SBPL_2DGRIDSEARCH_TERM_CONDITION termination_condition)
{
    startx_c /= downsample_;
    starty_c /= downsample_;
    goalx_c /= downsample_;
    goaly_c /= downsample_;

    switch (OPENtype_) {
    case SBPL_2DGRIDSEARCH_OPENTYPE_HEAP:
        return SBPL2DGridSearch::search_withheap(Grid2D, obsthresh, startx_c, starty_c, goalx_c, goaly_c,
                                                 termination_condition);
        break;
    case SBPL_2DGRIDSEARCH_OPENTYPE_SLIDINGBUCKETS:
        return SBPL2DGridSearch::search_withslidingbuckets(Grid2D, obsthresh, startx_c, starty_c, goalx_c, goaly_c,
                                                           termination_condition);
        break;
    default:
        std::stringstream ss("ERROR: unknown data structure type = ");
        ss << OPENtype_ << " for OPEN2D";
        throw SBPL_Exception(ss.str());
    };
    return false;
}